

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O0

String * __thiscall
stick::URI::decode(String *__return_storage_ptr__,URI *this,String *_str,Error *_error)

{
  int iVar1;
  Allocator *pAVar2;
  ConstIter pcVar3;
  char *pcVar4;
  int *piVar5;
  char _args_1;
  String local_258;
  Error local_238;
  undefined1 local_1e0 [8];
  String tmp2;
  Error local_1a0;
  char local_141;
  undefined1 local_140 [7];
  char lo;
  Error local_120;
  char local_c5;
  uint local_c4;
  undefined1 local_c0 [3];
  char hi;
  Error local_a0;
  long local_48;
  Int64 tmp;
  char *pcStack_38;
  char c;
  ConstIter it;
  Error *local_28;
  Error *_error_local;
  String *_str_local;
  URI *this_local;
  String *ret;
  
  it._7_1_ = 0;
  local_28 = _error;
  _error_local = (Error *)_str;
  _str_local = &this->m_scheme;
  this_local = (URI *)__return_storage_ptr__;
  pAVar2 = defaultAllocator();
  String::String(__return_storage_ptr__,pAVar2);
  String::reserve(__return_storage_ptr__,0x80);
  pcStack_38 = String::begin((String *)_error_local);
  do {
    pcVar4 = pcStack_38;
    pcVar3 = String::end((String *)_error_local);
    if (pcVar4 == pcVar3) {
      it._7_1_ = 1;
      local_c4 = 1;
LAB_0011e30d:
      if ((it._7_1_ & 1) == 0) {
        String::~String(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    tmp._7_1_ = *pcStack_38;
    if (tmp._7_1_ == '%') {
      pcVar4 = pcStack_38 + 1;
      pcStack_38 = pcVar4;
      pcVar3 = String::end((String *)_error_local);
      if (pcVar4 == pcVar3) {
        pAVar2 = defaultAllocator();
        String::String((String *)local_c0,"Two hex digits have to follow the percent sign!",pAVar2);
        Error::Error<stick::ec::MiscErrorCode>
                  (&local_a0,BadURI,(String *)local_c0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                   ,0x138,(type *)0x0);
        Error::operator=(local_28,&local_a0);
        Error::~Error(&local_a0);
        String::~String((String *)local_c0);
        it._7_1_ = 1;
        local_c4 = 1;
        goto LAB_0011e30d;
      }
      local_c5 = *pcStack_38;
      pcVar4 = pcStack_38 + 1;
      pcStack_38 = pcVar4;
      pcVar3 = String::end((String *)_error_local);
      if (pcVar4 == pcVar3) {
        pAVar2 = defaultAllocator();
        String::String((String *)local_140,"Two hex digits have to follow the percent sign!",pAVar2)
        ;
        Error::Error<stick::ec::MiscErrorCode>
                  (&local_120,BadURI,(String *)local_140,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                   ,0x144,(type *)0x0);
        Error::operator=(local_28,&local_120);
        Error::~Error(&local_120);
        String::~String((String *)local_140);
        it._7_1_ = 1;
        local_c4 = 1;
        goto LAB_0011e30d;
      }
      local_141 = *pcStack_38;
      iVar1 = isxdigit((int)local_c5);
      _args_1 = (char)pcVar3;
      if ((iVar1 == 0) || (iVar1 = isxdigit((int)local_141), iVar1 == 0)) {
        pAVar2 = defaultAllocator();
        String::String((String *)&tmp2.m_allocator,"The high or low digit is not a valid hex digit!"
                       ,pAVar2);
        Error::Error<stick::ec::MiscErrorCode>
                  (&local_1a0,BadURI,(String *)&tmp2.m_allocator,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                   ,0x14f,(type *)0x0);
        Error::operator=(local_28,&local_1a0);
        Error::~Error(&local_1a0);
        String::~String((String *)&tmp2.m_allocator);
        it._7_1_ = 1;
        local_c4 = 1;
        goto LAB_0011e30d;
      }
      String::concat<char,char>
                ((String *)local_1e0,(String *)(ulong)(uint)(int)local_c5,local_141,_args_1);
      piVar5 = __errno_location();
      *piVar5 = 0;
      pcVar4 = String::cString((String *)local_1e0);
      local_48 = strtol(pcVar4,(char **)0x0,0x10);
      piVar5 = __errno_location();
      iVar1 = *piVar5;
      if (iVar1 == 0) {
        String::append(__return_storage_ptr__,(char)local_48);
      }
      else {
        pAVar2 = defaultAllocator();
        String::String(&local_258,"Error extracting char from hex digits!",pAVar2);
        Error::Error<stick::ec::MiscErrorCode>
                  (&local_238,BadURI,&local_258,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                   ,0x159,(type *)0x0);
        Error::operator=(local_28,&local_238);
        Error::~Error(&local_238);
        String::~String(&local_258);
        it._7_1_ = 1;
      }
      local_c4 = (uint)(iVar1 != 0);
      String::~String((String *)local_1e0);
      if (local_c4 != 0) goto LAB_0011e30d;
    }
    else {
      String::append(__return_storage_ptr__,*pcStack_38);
    }
    pcStack_38 = pcStack_38 + 1;
  } while( true );
}

Assistant:

String URI::decode(const String & _str, Error & _error) const
{
    String ret;
    ret.reserve(128);
    String::ConstIter it = _str.begin();
    for (; it != _str.end(); ++it)
    {
        char c = *it;
        Int64 tmp;
        if (c == '%')
        {
            // std::stringstream strstr;
            it++;
            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char hi = *it;
            it++;

            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char lo = *it;

            if (!isxdigit(hi) || !isxdigit(lo))
            {
                _error = Error(ec::BadURI,
                               "The high or low digit is not a valid hex digit!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            String tmp2 = String::concat(hi, lo);
            errno = 0;
            tmp = strtol(tmp2.cString(), NULL, 16);
            if (errno != 0)
            {
                _error = Error(
                    ec::BadURI, "Error extracting char from hex digits!", STICK_FILE, STICK_LINE);
                return ret;
            }
            ret.append((char)tmp);
        }
        else
        {
            ret.append(*it);
        }
    }

    return ret;
}